

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O3

void __thiscall
tlx::CmdlineParser::ArgumentStringlist::print_value(ArgumentStringlist *this,ostream *os)

{
  ostream *poVar1;
  pointer pbVar2;
  ulong uVar3;
  long lVar4;
  char local_36;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
  if ((this->dest_->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (this->dest_->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      if (uVar3 == 0) {
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_36,1);
        pbVar2 = (this->dest_->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        pbVar2 = (pointer)((long)&(((this->dest_->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar4);
      }
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_33,1);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar3 < (ulong)((long)(this->dest_->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->dest_->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

void print_value(std::ostream& os) const final {
        os << '[';
        for (size_t i = 0; i < dest_.size(); ++i) {
            if (i != 0)
                os << ',';
            os << '"' << dest_[i] << '"';
        }
        os << ']';
    }